

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcprrpacket.h
# Opt level: O0

int32_t __thiscall jrtplib::RTCPRRPacket::GetLostPacketCount(RTCPRRPacket *this,int index)

{
  RTCPReceiverReport *pRVar1;
  int32_t *count2;
  uint32_t count;
  RTCPReceiverReport *r;
  int index_local;
  RTCPRRPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pRVar1 = GotoReport(this,index);
    count2._4_4_ = (uint)CONCAT12(pRVar1->packetslost[0],
                                  CONCAT11(pRVar1->packetslost[1],pRVar1->packetslost[2]));
    if ((pRVar1->packetslost[0] & 0x80) != 0) {
      count2._4_4_ = count2._4_4_ | 0xff000000;
    }
    this_local._4_4_ = count2._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

inline int32_t RTCPRRPacket::GetLostPacketCount(int index) const
{
	if (!knownformat)
		return 0;
	RTCPReceiverReport *r = GotoReport(index);
	uint32_t count = ((uint32_t)r->packetslost[2])|(((uint32_t)r->packetslost[1])<<8)|(((uint32_t)r->packetslost[0])<<16);
	if ((count&0x00800000) != 0) // test for negative number
		count |= 0xFF000000;
	int32_t *count2 = (int32_t *)(&count);
	return (*count2);
}